

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenDiskFile(DiskSourceTree *this,string *filename)

{
  int file_descriptor;
  int *piVar1;
  FileInputStream *this_00;
  
  do {
    file_descriptor = open((filename->_M_dataplus)._M_p,0);
    if (-1 < file_descriptor) {
      this_00 = (FileInputStream *)operator_new(0x58);
      io::FileInputStream::FileInputStream(this_00,file_descriptor,-1);
      (this_00->copying_input_).close_on_delete_ = true;
      return &this_00->super_ZeroCopyInputStream;
    }
    piVar1 = __errno_location();
  } while (*piVar1 == 4);
  return (ZeroCopyInputStream *)0x0;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenDiskFile(
    const string& filename) {
  int file_descriptor;
  do {
    file_descriptor = open(filename.c_str(), O_RDONLY);
  } while (file_descriptor < 0 && errno == EINTR);
  if (file_descriptor >= 0) {
    io::FileInputStream* result = new io::FileInputStream(file_descriptor);
    result->SetCloseOnDelete(true);
    return result;
  } else {
    return NULL;
  }
}